

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void __thiscall Assimp::ColladaLoader::ColladaLoader(ColladaLoader *this)

{
  _Rb_tree_header *p_Var1;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_007fcca8;
  (this->mFileName)._M_dataplus._M_p = (pointer)&(this->mFileName).field_2;
  (this->mFileName)._M_string_length = 0;
  (this->mFileName).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->mMeshIndexByID)._M_t._M_impl.super__Rb_tree_header;
  (this->mMeshIndexByID)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mMeshIndexByID)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->mMeshIndexByID)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->mMeshIndexByID)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mMeshIndexByID)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mMeshIndexByID)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mMeshIndexByID)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mMeshIndexByID)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mMaterialIndexByName)._M_t._M_impl.super__Rb_tree_header;
  (this->mMaterialIndexByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0
  ;
  (this->mMaterialIndexByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this->mMaterialIndexByName)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mMaterialIndexByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mMaterialIndexByName)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mMeshIndexByID)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mMaterialIndexByName)._M_t._M_impl = 0;
  (this->mMaterialIndexByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mMaterialIndexByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  this->mNodeNameCounter = 0;
  memset(&(this->mMaterialIndexByName)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xb3);
  return;
}

Assistant:

ColladaLoader::ColladaLoader()
    : mFileName()
    , mMeshIndexByID()
    , mMaterialIndexByName()
    , mMeshes()
    , newMats()
    , mCameras()
    , mLights()
    , mTextures()
    , mAnims()
    , noSkeletonMesh(false)
    , ignoreUpDirection(false)
    , useColladaName(false)
    , mNodeNameCounter(0) {
    // empty
}